

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O1

Content * __thiscall Jupiter::HTTP::Server::Directory::find(Directory *this,string_view in_name)

{
  pointer puVar1;
  Directory *pDVar2;
  pointer puVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  void *pvVar7;
  size_t sVar8;
  Content *pCVar9;
  Content *__s;
  Content *extraout_RDX;
  Content *pCVar10;
  size_t __n_00;
  size_type __rlen;
  size_t sVar11;
  uint uVar12;
  size_type __n;
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  *content_item;
  pointer puVar13;
  unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
  *directory;
  pointer puVar14;
  bool bVar15;
  undefined4 extraout_var;
  
  __s = (Content *)in_name._M_str;
  __n_00 = in_name._M_len;
  if (__n_00 == 0) {
    sVar11 = 0xffffffffffffffff;
    pCVar9 = __s;
  }
  else {
    pvVar7 = memchr(__s,0x2f,__n_00);
    sVar11 = -(ulong)(pvVar7 == (void *)0x0) | (long)pvVar7 - (long)__s;
    pCVar9 = extraout_RDX;
  }
  if (sVar11 == 0xffffffffffffffff) {
    if (__n_00 == 0) {
      uVar12 = 0;
    }
    else {
      sVar11 = 0;
      uVar12 = 0;
      do {
        uVar12 = uVar12 + (int)*(char *)((long)&__s->_vptr_Content + sVar11);
        sVar11 = sVar11 + 1;
      } while (__n_00 != sVar11);
    }
    puVar3 = (this->content).
             super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar13 = (this->content).
                   super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar3;
        puVar13 = puVar13 + 1) {
      pCVar10 = (puVar13->_M_t).
                super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                ._M_t.
                super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl;
      bVar5 = true;
      if (pCVar10->name_checksum == uVar12) {
        sVar4 = (pCVar10->name)._M_string_length;
        bVar15 = sVar4 == __n_00;
        if ((__n_00 != 0) && (sVar4 == __n_00)) {
          iVar6 = bcmp(__s,(pCVar10->name)._M_dataplus._M_p,__n_00);
          bVar15 = iVar6 == 0;
        }
        bVar5 = (bool)(bVar15 ^ 1);
        if (bVar15) {
          pCVar9 = pCVar10;
        }
      }
      if (!bVar5) {
        return pCVar9;
      }
    }
  }
  else {
    if (sVar11 == 0) {
      uVar12 = 0;
    }
    else {
      sVar8 = 0;
      uVar12 = 0;
      do {
        uVar12 = uVar12 + (int)*(char *)((long)&__s->_vptr_Content + sVar8);
        sVar8 = sVar8 + 1;
      } while (sVar11 != sVar8);
    }
    puVar14 = (this->directories).
              super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->directories).
             super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar14 != puVar1) {
      pCVar10 = (Content *)((long)&__s->_vptr_Content + sVar11 + 1);
      pCVar9 = pCVar10;
      do {
        pDVar2 = (puVar14->_M_t).
                 super___uniq_ptr_impl<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Directory_*,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
                 .super__Head_base<0UL,_Jupiter::HTTP::Server::Directory_*,_false>._M_head_impl;
        bVar5 = true;
        if (((pDVar2->name_checksum == uVar12) && (sVar11 == (pDVar2->name)._M_string_length)) &&
           ((sVar11 == 0 || (iVar6 = bcmp(__s,(pDVar2->name)._M_dataplus._M_p,sVar11), iVar6 == 0)))
           ) {
          iVar6 = (*pDVar2->_vptr_Directory[3])(pDVar2,__n_00 - (sVar11 + 1),pCVar10);
          pCVar9 = (Content *)CONCAT44(extraout_var,iVar6);
          bVar5 = false;
        }
        if (!bVar5) {
          return pCVar9;
        }
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar1);
    }
  }
  return (Content *)0x0;
}

Assistant:

Jupiter::HTTP::Server::Content *Jupiter::HTTP::Server::Directory::find(std::string_view in_name) {
	std::string_view in_name_ref = in_name;
	while (!in_name_ref.empty() && in_name_ref.front() == '/') {
		in_name.remove_prefix(1);
	}

	size_t index = in_name_ref.find('/');
	if (index == std::string_view::npos) { // Search content
		unsigned int content_name_checksum = calc_checksum(in_name_ref);
		index = content.size();
		for (auto& content_item : content) {
			if (content_item->name_checksum == content_name_checksum && content_item->name == in_name_ref) {
				return content_item.get();
			}
		}
		return nullptr; // No such content
	}

	// Just use split_once?
	std::string_view dir_name(in_name_ref.data(), index);
	in_name_ref.remove_prefix(dir_name.size() + 1);
	unsigned int dir_name_checksum = calc_checksum(dir_name);

	for (auto& directory : directories) {
		if (directory->name_checksum == dir_name_checksum && directory->name == dir_name) {
			return directory->find(in_name_ref);
		}
	}

	return nullptr; // No such directory
}